

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall t_netstd_generator::generate_netstd_union(t_netstd_generator *this,t_struct *tunion)

{
  int expected;
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  int __oflag;
  t_netstd_generator *this_00;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  string f_union_name;
  ofstream_with_content_based_conditional_update f_union;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [32];
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1c0;
  
  expected = (this->super_t_oop_generator).super_t_generator.indent_;
  std::operator+(&local_240,&this->namespace_dir_,"/");
  iVar1 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                 &local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_220 + 0x40),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                 ".cs");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_240);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1c0);
  std::__cxx11::string::string
            ((string *)&local_240,local_1e0._M_dataplus._M_p,(allocator *)local_220);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1c0,(char *)&local_240,__oflag);
  std::__cxx11::string::~string((string *)&local_240);
  reset_indent(this);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_240,this);
  poVar2 = std::operator<<((ostream *)&local_1c0,(string *)&local_240);
  netstd_type_usings_abi_cxx11_((string *)local_220,this);
  this_00 = (t_netstd_generator *)local_220;
  poVar2 = std::operator<<(poVar2,(string *)this_00);
  netstd_thrift_usings_abi_cxx11_((string *)(local_220 + 0x20),this_00);
  poVar2 = std::operator<<(poVar2,(string *)(local_220 + 0x20));
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_220 + 0x20));
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)&local_240);
  out = &local_1c0;
  generate_netstd_union_definition(this,(ostream *)out,tunion);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_1c0,(int)out);
  t_generator::indent_validate((t_generator *)this,expected,"generate_netstd_union.");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1c0);
  std::__cxx11::string::~string((string *)(local_220 + 0x40));
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union(t_struct* tunion)
{
    int ic = indent_count();

    string f_union_name = namespace_dir_ + "/" + (tunion->get_name()) + ".cs";
    ofstream_with_content_based_conditional_update f_union;

    f_union.open(f_union_name.c_str());

    reset_indent();
    f_union << autogen_comment() << netstd_type_usings() << netstd_thrift_usings() << endl;

    generate_netstd_union_definition(f_union, tunion);

    f_union.close();

    indent_validate(ic, "generate_netstd_union.");
}